

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O1

void __thiscall higan::Acceptor::Acceptor(Acceptor *this,EventLoop *loop,InetAddress *address)

{
  Socket *this_00;
  EventLoop *loop_00;
  int fd;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->loop_ = loop;
  this_00 = &this->listening_socket_;
  Socket::Socket(this_00,address);
  loop_00 = this->loop_;
  local_58._M_unused._M_object = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"acceptor","");
  fd = Socket::GetFd(this_00);
  Channel::Channel(&this->channel_,loop_00,(string *)&local_58,fd);
  if ((code **)local_58._M_unused._0_8_ != &local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48 + 1));
  }
  (this->newconnection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->newconnection_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->newconnection_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->newconnection_callback_).super__Function_base._M_functor + 8) = 0;
  Socket::SetReuseAddr(this_00);
  Socket::SetReusePort(this_00);
  Socket::Bind(this_00);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = OnNewConnectionInternal;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Acceptor **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::Acceptor::*(higan::Acceptor_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::Acceptor::*(higan::Acceptor_*))()>_>
             ::_M_manager;
  Channel::SetReadableCallback(&this->channel_,(ChannelCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

Acceptor::Acceptor(EventLoop* loop, const InetAddress& address):
		loop_(loop),
		listening_socket_(address),
		channel_(loop_, "acceptor", listening_socket_.GetFd())
{
	listening_socket_.SetReuseAddr();
	listening_socket_.SetReusePort();
	listening_socket_.Bind();

	channel_.SetReadableCallback(std::bind(&Acceptor::OnNewConnectionInternal, this));
}